

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::set_priority(raft_server *this,int srv_id,int new_priority)

{
  bool bVar1;
  __int_type_conflict2 _Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  element_type *peVar6;
  ulong uVar7;
  element_type *peVar8;
  element_type *peVar9;
  shared_ptr<nuraft::buffer> *args_1;
  shared_ptr<nuraft::cluster_config> *psVar10;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  ptr<log_entry> entry;
  ptr<buffer> new_conf_buf;
  srv_config *s_conf;
  shared_ptr<nuraft::srv_config> *entry_1;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *__range1;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *s_confs;
  ptr<cluster_config> cloned_config;
  ptr<buffer> enc_conf;
  ptr<cluster_config> cur_config;
  unique_lock<std::recursive_mutex> guard;
  memory_order __b;
  raft_server *in_stack_fffffffffffffdf8;
  unique_lock<std::recursive_mutex> *in_stack_fffffffffffffe00;
  __atomic_base<int> *in_stack_fffffffffffffe08;
  raft_server *in_stack_fffffffffffffe18;
  raft_server *in_stack_fffffffffffffe40;
  ptr<log_entry> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  cluster_config *in_stack_fffffffffffffe98;
  string local_130 [32];
  element_type *local_110;
  __shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *local_108;
  _Self local_100;
  _Self local_f8;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *local_f0;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *local_e8;
  string local_c0 [52];
  undefined4 local_8c;
  string local_88 [32];
  string local_68 [64];
  uint local_28;
  uint local_24;
  long lVar11;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  
  local_28 = in_EDX;
  local_24 = in_ESI;
  lVar11 = in_RDI;
  std::unique_lock<std::recursive_mutex>::unique_lock
            (in_stack_fffffffffffffe00,(mutex_type *)in_stack_fffffffffffffdf8);
  iVar3 = *(int *)(in_RDI + 0x38);
  _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_fffffffffffffe08);
  if (iVar3 == _Var2) {
    if ((*(uint *)(in_RDI + 0x38) == local_24) && (local_28 == 0)) {
      broadcast_priority_change
                ((raft_server *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (int)((ulong)lVar11 >> 0x20),(int)lVar11);
    }
    get_config(in_stack_fffffffffffffe18);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x390));
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x251174);
        in_stack_fffffffffffffe54 = (**(code **)(*(long *)peVar6 + 0x38))();
        if (3 < in_stack_fffffffffffffe54) {
          in_stack_fffffffffffffe40 =
               (raft_server *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2511a7);
          peVar8 = std::
                   __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2511c0);
          in_stack_fffffffffffffe48 = (ptr<log_entry> *)cluster_config::get_log_idx(peVar8);
          peVar8 = std::
                   __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2511e3);
          uVar7 = cluster_config::get_prev_log_idx(peVar8);
          msg_if_given_abi_cxx11_
                    ((char *)local_c0,"uncommitted config exists at log %lu, prev log %lu",
                     in_stack_fffffffffffffe48,uVar7);
          (*in_stack_fffffffffffffe40->_vptr_raft_server[8])
                    (in_stack_fffffffffffffe40,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"set_priority",0x44,local_c0);
          std::__cxx11::string::~string(local_c0);
        }
      }
      std::shared_ptr<nuraft::cluster_config>::operator=
                ((shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffe00,
                 (shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffdf8);
    }
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2512bc);
    cluster_config::serialize(in_stack_fffffffffffffe98);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe00);
    cluster_config::deserialize((buffer *)in_stack_fffffffffffffe18);
    peVar8 = std::
             __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2512fa);
    local_f0 = cluster_config::get_servers_abi_cxx11_(peVar8);
    local_e8 = local_f0;
    local_f8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         ::begin((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  *)in_stack_fffffffffffffdf8);
    local_100._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         ::end((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                *)in_stack_fffffffffffffdf8);
    while (bVar1 = std::operator!=(&local_f8,&local_100), bVar1) {
      local_108 = &std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                             ((_List_iterator<std::shared_ptr<nuraft::srv_config>_> *)
                              in_stack_fffffffffffffe00)->
                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>;
      local_110 = std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::get(local_108);
      uVar4 = srv_config::get_id(local_110);
      if (uVar4 == local_24) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2513ed);
          iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
          if (3 < iVar3) {
            in_stack_fffffffffffffe18 =
                 (raft_server *)
                 std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x251420);
            uVar4 = local_24;
            uVar5 = srv_config::get_priority(local_110);
            msg_if_given_abi_cxx11_
                      ((char *)local_130,"Change server %d priority %d -> %d",(ulong)uVar4,
                       (ulong)uVar5,(ulong)local_28);
            (*in_stack_fffffffffffffe18->_vptr_raft_server[8])
                      (in_stack_fffffffffffffe18,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                       ,"set_priority",0x51,local_130);
            std::__cxx11::string::~string(local_130);
          }
        }
        srv_config::set_priority(local_110,local_28);
      }
      std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++(&local_f8);
    }
    peVar8 = std::
             __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25153c);
    peVar9 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x251555);
    args_1 = (shared_ptr<nuraft::buffer> *)(**(code **)(*(long *)peVar9 + 0x10))();
    cluster_config::set_log_idx(peVar8,(ulong)args_1);
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x251586);
    cluster_config::serialize(in_stack_fffffffffffffe98);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2515ac);
    in_stack_fffffffffffffe00 =
         (unique_lock<std::recursive_mutex> *)srv_state::get_term((srv_state *)0x2515b4);
    psVar10 = (shared_ptr<nuraft::cluster_config> *)timer_helper::get_timeofday_us();
    cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              ((unsigned_long *)in_stack_fffffffffffffe18,args_1,(log_val_type *)peVar8,
               (unsigned_long *)in_stack_fffffffffffffe00);
    *(undefined1 *)(in_RDI + 0xe9) = 1;
    std::shared_ptr<nuraft::cluster_config>::operator=
              ((shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffe00,psVar10);
    store_log_entry((raft_server *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe48,(ulong)in_stack_fffffffffffffe40);
    request_append_entries(in_stack_fffffffffffffe40);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x251670);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x25167d);
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x25168a);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x251697);
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x2516a4);
    local_8c = 0;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x250e0e);
      iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
      if (3 < iVar3) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x250e47);
        uVar4 = *(uint *)(in_RDI + 0x38);
        std::operator&(memory_order_seq_cst,__memory_order_mask);
        in_stack_ffffffffffffffec = *(uint *)(in_RDI + 0x34);
        msg_if_given_abi_cxx11_
                  ((char *)local_68,
                   "Got set_priority request but I\'m not a leader: my ID %d, leader %d",
                   (ulong)uVar4,(ulong)in_stack_ffffffffffffffec);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                   ,"set_priority",0x2a,local_68);
        std::__cxx11::string::~string(local_68);
      }
    }
    bVar1 = is_leader_alive(in_stack_fffffffffffffdf8);
    if (!bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x250fed);
        iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
        if (2 < iVar3) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x251020);
          msg_if_given_abi_cxx11_((char *)local_88,"No live leader now, broadcast priority change");
          (**(code **)(*(long *)peVar6 + 0x40))
                    (peVar6,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"set_priority",0x2d,local_88);
          std::__cxx11::string::~string(local_88);
        }
      }
      broadcast_priority_change
                ((raft_server *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (int)((ulong)lVar11 >> 0x20),(int)lVar11);
    }
    local_8c = 1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_fffffffffffffe00);
  return;
}

Assistant:

void raft_server::set_priority(const int srv_id, const int new_priority)
{
    recur_lock(lock_);

    // Do nothing if not a leader.
    if (id_ != leader_) {
        p_in("Got set_priority request but I'm not a leader: my ID %d, leader %d",
             id_, leader_.load());

        if (!is_leader_alive()) {
            p_wn("No live leader now, broadcast priority change");
            broadcast_priority_change(srv_id, new_priority);
        }
        return;
    }

    if (id_ == srv_id && new_priority == 0) {
        // Step down.
        // Even though current leader (myself) can send append_entries()
        // request, it cannot commit the priority change as it will
        // immediately yield its leadership.
        // So in this case, boradcast this change.
        broadcast_priority_change(srv_id, new_priority);
    }

    // Clone current cluster config.
    ptr<cluster_config> cur_config = get_config();

    // NOTE: Need to honor uncommitted config,
    //       refer to comment in `sync_log_to_new_srv()`
    if (uncommitted_config_) {
        p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        cur_config = uncommitted_config_;
    }

    ptr<buffer> enc_conf = cur_config->serialize();
    ptr<cluster_config> cloned_config = cluster_config::deserialize(*enc_conf);

    std::list<ptr<srv_config>>& s_confs = cloned_config->get_servers();

    for (auto& entry: s_confs) {
        srv_config* s_conf = entry.get();
        if (s_conf->get_id() == srv_id) {
            p_in("Change server %d priority %d -> %d",
                 srv_id, s_conf->get_priority(), new_priority);
            s_conf->set_priority(new_priority);
        }
    }

    // Create a log for new configuration, it should be replicated.
    cloned_config->set_log_idx(log_store_->next_slot());
    ptr<buffer> new_conf_buf(cloned_config->serialize());
    ptr<log_entry> entry( cs_new<log_entry>
                          ( state_->get_term(),
                            new_conf_buf,
                            log_val_type::conf,
                            timer_helper::get_timeofday_us() ) );

    config_changing_ = true;
    uncommitted_config_ = cloned_config;

    store_log_entry(entry);
    request_append_entries();
}